

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

uint64 gflags::Uint64FromEnv(char *v,uint64 dflt)

{
  bool bVar1;
  uint64 *puVar2;
  FlagValue ifv;
  string valstr;
  
  valstr._M_dataplus._M_p = (pointer)&valstr.field_2;
  valstr._M_string_length = 0;
  valstr.field_2._M_local_buf[0] = '\0';
  bVar1 = SafeGetEnv(v,&valstr);
  if (bVar1) {
    puVar2 = (uint64 *)operator_new(8);
    ifv.type_ = '\x04';
    ifv.owns_value_ = true;
    ifv.value_buffer_ = puVar2;
    bVar1 = anon_unknown_2::FlagValue::ParseFrom(&ifv,valstr._M_dataplus._M_p);
    if (!bVar1) {
      anon_unknown_2::ReportError
                (DIE,"ERROR: error parsing env variable \'%s\' with value \'%s\'\n",v,
                 valstr._M_dataplus._M_p);
    }
    dflt = *puVar2;
    anon_unknown_2::FlagValue::~FlagValue(&ifv);
  }
  std::__cxx11::string::~string((string *)&valstr);
  return dflt;
}

Assistant:

uint64 Uint64FromEnv(const char *v, uint64 dflt) {
  return GetFromEnv(v, dflt);
}